

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_texture_gather_instruction
               (bool compare,bool raw,Impl *impl,CallInst *instruction)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  ComponentType CVar5;
  Id IVar6;
  Id IVar7;
  Id type_id;
  Id IVar8;
  uint uVar9;
  Builder *this;
  Value *pVVar10;
  mapped_type *pmVar11;
  Type *pTVar12;
  Operation *pOVar13;
  mapped_type *this_00;
  Operation *pOVar14;
  Op OVar15;
  ulong uVar16;
  uint i_1;
  long lVar17;
  Op op;
  uint i;
  ulong uVar18;
  bool bVar19;
  undefined1 in_stack_ffffffffffffff38;
  Id local_bc;
  Id components [2];
  uint32_t image_flags;
  mapped_type *local_88;
  uint local_7c;
  uint32_t num_coords;
  uint32_t num_coords_full;
  Id offsets [2];
  Id components64 [4];
  Id image_id;
  Id coords [4];
  
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  bVar4 = true;
  if (bVar3) {
    this = Converter::Impl::builder(impl);
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar6 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    image_id = IVar6;
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar7 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    IVar6 = Converter::Impl::build_sampled_image(impl,IVar6,IVar7,false);
    local_88 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->handle_to_resource_meta,&image_id);
    num_coords_full = 0;
    num_coords = 0;
    bVar4 = get_image_dimensions(impl,image_id,&num_coords_full,&num_coords);
    uVar2 = num_coords_full;
    if (bVar4) {
      offsets[0] = 0;
      offsets[1] = 0;
      image_flags = 0;
      coords[0] = 0;
      coords[1] = 0;
      coords[2] = 0;
      coords[3] = 0;
      uVar16 = (ulong)num_coords_full;
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar18 + 3);
        IVar7 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
        coords[uVar18] = IVar7;
      }
      IVar7 = spv::Builder::makeFloatType(this,0x20);
      IVar7 = Converter::Impl::build_vector(impl,IVar7,coords,uVar2);
      local_7c = num_coords;
      if (num_coords == 2) {
        get_texel_offsets(impl,instruction,&image_flags,7,2,offsets,(bool)in_stack_ffffffffffffff38)
        ;
      }
      if (raw) {
        spv::Builder::makeUintConstant(this,0,false);
      }
      else {
        if (compare) {
          uVar1 = 10;
        }
        else {
          uVar1 = 9;
        }
        pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar1);
        Converter::Impl::get_id_for_value(impl,pVVar10,0);
      }
      components64._0_8_ = instruction;
      pmVar11 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_composite_meta,(key_type *)components64);
      uVar1 = pmVar11->access_mask;
      if ((uVar1 & 0x10) != 0) {
        spv::Builder::addCapability(this,CapabilitySparseResidency);
      }
      CVar5 = Converter::Impl::get_effective_typed_resource_type(local_88->component_type);
      type_id = Converter::Impl::get_type_id(impl,CVar5,1,4,false);
      IVar8 = type_id;
      if ((uVar1 & 0x10) != 0) {
        components[0] = spv::Builder::makeUintType(this,0x20);
        components64[0] = 0;
        components64[1] = 0;
        components64[2] = 0;
        components64[3] = 0;
        components[1] = type_id;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)components64
                   ,components);
        IVar8 = Converter::Impl::get_struct_type
                          (impl,(Vector<spv::Id> *)components64,0,"SparseTexel");
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                      components64);
      }
      if (raw) {
        pTVar12 = LLVMBC::Value::getType((Value *)instruction);
        pTVar12 = LLVMBC::Type::getStructElementType(pTVar12,0);
        uVar9 = LLVMBC::Type::getIntegerBitWidth(pTVar12);
        bVar3 = uVar9 == 0x40;
      }
      else {
        bVar3 = false;
      }
      bVar19 = (uVar1 & 0x10) == 0;
      OVar15 = OpImageSparseDrefGather;
      if (bVar19) {
        OVar15 = OpImageDrefGather;
      }
      op = OpImageSparseGather;
      if (bVar19) {
        op = OpImageGather;
      }
      if (compare) {
        op = OVar15;
      }
      pOVar13 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar8);
      if ((uVar1 & 0x10) == 0) {
        pTVar12 = LLVMBC::Value::getType((Value *)instruction);
        pTVar12 = LLVMBC::Type::getStructElementType(pTVar12,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar12,pOVar13->id,true);
      }
      components64[2] = 3;
      components64[3] = 0;
      components[0] = IVar6;
      components[1] = IVar7;
      components64._0_8_ = components;
      Operation::add_ids(pOVar13,(initializer_list<unsigned_int> *)components64);
      uVar2 = image_flags;
      if (image_flags == 0) {
        IVar8 = 0;
      }
      else {
        Operation::add_literal(pOVar13,image_flags);
        IVar8 = build_texel_offset_vector(impl,offsets,local_7c,uVar2,true);
        Operation::add_id(pOVar13,IVar8);
      }
      Converter::Impl::add(impl,pOVar13,false);
      if (bVar3) {
        this_00 = (mapped_type *)Converter::Impl::allocate(impl,OpImageGather,type_id);
        components[0] = IVar6;
        components[1] = IVar7;
        spv::Builder::makeUintConstant(this,1,false);
        components64[2] = 3;
        components64[3] = 0;
        components64._0_8_ = components;
        Operation::add_ids((Operation *)this_00,(initializer_list<unsigned_int> *)components64);
        if (uVar2 != 0) {
          Operation::add_literal((Operation *)this_00,uVar2);
          Operation::add_id((Operation *)this_00,IVar8);
        }
        Converter::Impl::add(impl,(Operation *)this_00,false);
        local_88 = this_00;
        if ((uVar1 & 0x10) == 0) {
          local_bc = pOVar13->id;
        }
        else {
          pOVar14 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
          local_bc = pOVar14->id;
          Operation::add_id(pOVar14,pOVar13->id);
          Operation::add_literal(pOVar14,1);
          Converter::Impl::add(impl,pOVar14,false);
        }
        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
          IVar6 = spv::Builder::makeUintType(this,0x20);
          pOVar13 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar6);
          IVar6 = spv::Builder::makeUintType(this,0x20);
          pOVar14 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar6);
          Operation::add_id(pOVar13,local_bc);
          Operation::add_literal(pOVar13,(uint32_t)lVar17);
          Operation::add_id(pOVar14,local_88->raw_component_vecsize);
          Operation::add_literal(pOVar14,(uint32_t)lVar17);
          Converter::Impl::add(impl,pOVar13,false);
          Converter::Impl::add(impl,pOVar14,false);
          components[0] = pOVar13->id;
          components[1] = pOVar14->id;
          IVar6 = spv::Builder::makeUintType(this,0x20);
          IVar6 = Converter::Impl::build_vector(impl,IVar6,components,2);
          IVar7 = spv::Builder::makeUintType(this,0x40);
          pOVar13 = Converter::Impl::allocate(impl,OpBitcast,IVar7);
          Operation::add_id(pOVar13,IVar6);
          components64[lVar17] = pOVar13->id;
          Converter::Impl::add(impl,pOVar13,false);
        }
        IVar6 = spv::Builder::makeUintType(this,0x40);
        IVar6 = Converter::Impl::build_vector(impl,IVar6,components64,4);
        if ((uVar1 & 0x10) == 0) {
          Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar6);
          return bVar4;
        }
        pTVar12 = LLVMBC::Value::getType((Value *)instruction);
        pTVar12 = LLVMBC::Type::getStructElementType(pTVar12,0);
        CVar5 = U64;
      }
      else {
        pTVar12 = LLVMBC::Value::getType((Value *)instruction);
        pTVar12 = LLVMBC::Type::getStructElementType(pTVar12,0);
        CVar5 = local_88->component_type;
        if ((uVar1 & 0x10) == 0) {
          Converter::Impl::fixup_load_type_typed(impl,CVar5,4,(Value *)instruction,pTVar12);
          build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
          return bVar4;
        }
        IVar6 = 0;
      }
      Converter::Impl::repack_sparse_feedback(impl,CVar5,4,(Value *)instruction,pTVar12,IVar6);
    }
  }
  return bVar4;
}

Assistant:

bool emit_texture_gather_instruction(bool compare, bool raw, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, false);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coords[4] = {};
	spv::Id offsets[2] = {};
	uint32_t image_flags = 0;

	for (unsigned i = 0; i < num_coords_full; i++)
		coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	spv::Id coord_id = impl.build_vector(builder.makeFloatType(32), coords, num_coords_full);

	if (num_coords == 2 && !get_texel_offsets(impl, instruction, image_flags, 7, num_coords, offsets, true))
		return false;

	spv::Id aux_id;

	if (!raw)
	{
		if (compare)
		{
			// TextureGatherCmp has a component here. Perhaps it is to select depth vs stencil?
			aux_id = impl.get_id_for_value(instruction->getOperand(10));
		}
		else
			aux_id = impl.get_id_for_value(instruction->getOperand(9));
	}
	else
		aux_id = builder.makeUintConstant(0);

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool raw_gather64 = raw && instruction->getType()->getStructElementType(0)->getIntegerBitWidth() == 64;

	spv::Op opcode;
	if (compare)
		opcode = sparse ? spv::OpImageSparseDrefGather : spv::OpImageDrefGather;
	else
		opcode = sparse ? spv::OpImageSparseGather : spv::OpImageGather;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_ids({ combined_image_sampler_id, coord_id, aux_id });

	spv::Id texel_offset_id = 0;
	if (image_flags)
	{
		op->add_literal(image_flags);
		texel_offset_id = build_texel_offset_vector(impl, offsets, num_coords, image_flags, true);
		op->add_id(texel_offset_id);
	}

	impl.add(op);

	if (raw_gather64)
	{
		Operation *op_green = impl.allocate(spv::OpImageGather, texel_type);
		op_green->add_ids({ combined_image_sampler_id, coord_id, builder.makeUintConstant(1) });

		if (image_flags)
		{
			op_green->add_literal(image_flags);
			op_green->add_id(texel_offset_id);
		}

		impl.add(op_green);

		spv::Id components64[4];
		spv::Id gather_result;

		if (sparse)
		{
			auto *extract_value = impl.allocate(spv::OpCompositeExtract, texel_type);
			gather_result = extract_value->id;
			extract_value->add_id(op->id);
			extract_value->add_literal(1);
			impl.add(extract_value);
		}
		else
			gather_result = op->id;

		for (unsigned i = 0; i < 4; i++)
		{
			auto *extr0 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			auto *extr1 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));

			extr0->add_id(gather_result);
			extr0->add_literal(i);
			extr1->add_id(op_green->id);
			extr1->add_literal(i);

			impl.add(extr0);
			impl.add(extr1);

			spv::Id components[2] = { extr0->id, extr1->id };
			spv::Id value = impl.build_vector(builder.makeUintType(32), components, 2);
			auto *bitcast_64 = impl.allocate(spv::OpBitcast, builder.makeUintType(64));
			bitcast_64->add_id(value);
			components64[i] = bitcast_64->id;

			impl.add(bitcast_64);
		}

		spv::Id u64_vector = impl.build_vector(builder.makeUintType(64), components64, 4);

		if (sparse)
		{
			auto *target_type = instruction->getType()->getStructElementType(0);
			impl.repack_sparse_feedback(DXIL::ComponentType::U64, 4, instruction, target_type, u64_vector);
		}
		else
		{
			impl.rewrite_value(instruction, u64_vector);
		}
	}
	else
	{
		auto *target_type = instruction->getType()->getStructElementType(0);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}